

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt_utils.h
# Opt level: O0

int get_coeff_cost_eob(int ci,tran_low_t abs_qc,int sign,int coeff_ctx,int dc_sign_ctx,
                      LV_MAP_COEFF_COST *txb_costs,int bhl,TX_CLASS tx_class)

{
  int level;
  int iVar1;
  int *coeff_lps;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  long in_R9;
  int br_ctx;
  int cost;
  int row;
  int col;
  int local_4c;
  
  coeff_lps = (int *)(in_R9 + 0x68 + (long)in_ECX * 0xc);
  local_4c = in_ESI;
  if (2 < in_ESI) {
    local_4c = 3;
  }
  level = coeff_lps[local_4c + -1];
  if (in_ESI != 0) {
    if (in_EDI == 0) {
      level = *(int *)(in_R9 + 0x620 + (long)in_R8D * 8 + (long)in_EDX * 4) + level;
    }
    else {
      level = level + 0x200;
    }
    if (2 < in_ESI) {
      iVar1 = get_br_cost(level,coeff_lps);
      level = iVar1 + level;
    }
  }
  return level;
}

Assistant:

static inline int get_coeff_cost_eob(int ci, tran_low_t abs_qc, int sign,
                                     int coeff_ctx, int dc_sign_ctx,
                                     const LV_MAP_COEFF_COST *txb_costs,
                                     int bhl, TX_CLASS tx_class) {
  int cost = 0;
  cost += txb_costs->base_eob_cost[coeff_ctx][AOMMIN(abs_qc, 3) - 1];
  if (abs_qc != 0) {
    if (ci == 0) {
      cost += txb_costs->dc_sign_cost[dc_sign_ctx][sign];
    } else {
      cost += av1_cost_literal(1);
    }
    if (abs_qc > NUM_BASE_LEVELS) {
      int br_ctx;
      br_ctx = get_br_ctx_eob(ci, bhl, tx_class);
      cost += get_br_cost(abs_qc, txb_costs->lps_cost[br_ctx]);
    }
  }
  return cost;
}